

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O0

void __thiscall
SignParameter_RelatedPubkeyTest_Test::SignParameter_RelatedPubkeyTest_Test
          (SignParameter_RelatedPubkeyTest_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__SignParameter_RelatedPubkeyTest_Test_009ec220;
  return;
}

Assistant:

TEST(SignParameter, RelatedPubkeyTest)
{
  const ByteData expect_message("773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca471907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b24226");
  const SigHashType expect_sighashtype(SigHashAlgorithm::kSigHashAll);
  const ByteData expect_signature("30440220773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca4702201907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b2422601");
  // constructor
  SignParameter sign_parameter = SignParameter(expect_message, true);
  CompareSignparameter(sign_parameter, expect_message, SignDataType::kSign,
      Pubkey(), true, expect_sighashtype, expect_signature);

  // copy constructor
  SignParameter copy;
  copy = sign_parameter;

  // set related pubkey
  const Pubkey expect_related_pubkey("0369809d2cfc44f823249169f44bf9de20fc6ed1d88482540831289947f7e82af5");
  sign_parameter.SetRelatedPubkey(expect_related_pubkey);
  CompareSignparameter(sign_parameter, expect_message, SignDataType::kSign, 
      expect_related_pubkey, true, expect_sighashtype, expect_signature);

  // test not to match related pubkeys
  ASSERT_FALSE(sign_parameter.GetRelatedPubkey().Equals(
      copy.GetRelatedPubkey()));
}